

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O1

void xmlFreeDocElementContent(xmlDocPtr doc,xmlElementContentPtr cur)

{
  xmlElementContentPtr pxVar1;
  xmlElementContentPtr pxVar2;
  bool bVar3;
  int iVar4;
  _xmlElementContent *p_Var5;
  xmlDictPtr dict;
  xmlChar *pxVar6;
  long lVar7;
  
  if (cur != (xmlElementContentPtr)0x0) {
    if (doc == (xmlDocPtr)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = doc->dict;
    }
    lVar7 = 0;
    do {
      while (p_Var5 = cur->c1, p_Var5 != (_xmlElementContent *)0x0) {
LAB_0018efac:
        lVar7 = lVar7 + 1;
        cur = p_Var5;
      }
      if (cur->c2 != (_xmlElementContent *)0x0) {
        p_Var5 = cur->c2;
        goto LAB_0018efac;
      }
      if (cur->type - XML_ELEMENT_CONTENT_PCDATA < 4) {
        pxVar6 = cur->name;
        if (dict == (xmlDictPtr)0x0) {
          if (pxVar6 != (xmlChar *)0x0) {
            (*xmlFree)(pxVar6);
          }
          pxVar6 = cur->prefix;
          if (pxVar6 != (xmlChar *)0x0) goto LAB_0018f088;
        }
        else {
          if ((pxVar6 != (xmlChar *)0x0) && (iVar4 = xmlDictOwns(dict,pxVar6), iVar4 == 0)) {
            (*xmlFree)(cur->name);
          }
          if ((cur->prefix != (xmlChar *)0x0) && (iVar4 = xmlDictOwns(dict,cur->prefix), iVar4 == 0)
             ) {
            pxVar6 = cur->prefix;
LAB_0018f088:
            (*xmlFree)(pxVar6);
          }
        }
        if ((lVar7 == 0) || (pxVar1 = cur->parent, pxVar1 == (xmlElementContentPtr)0x0)) {
          (*xmlFree)(cur);
          bVar3 = false;
        }
        else {
          (&pxVar1->c1)[cur != pxVar1->c1] = (_xmlElementContent *)0x0;
          (*xmlFree)(cur);
          pxVar2 = pxVar1->c2;
          cur = pxVar2;
          if (pxVar2 == (xmlElementContentPtr)0x0) {
            cur = pxVar1;
          }
          lVar7 = lVar7 - (ulong)(pxVar2 == (xmlElementContentPtr)0x0);
          bVar3 = true;
        }
      }
      else {
        bVar3 = false;
        __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0
                        ,(void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                        (char *)0x0,0,0,"%s","Internal: ELEMENT content corrupted invalid type\n");
      }
    } while (bVar3);
  }
  return;
}

Assistant:

void
xmlFreeDocElementContent(xmlDocPtr doc, xmlElementContentPtr cur) {
    xmlDictPtr dict = NULL;
    size_t depth = 0;

    if (cur == NULL)
        return;
    if (doc != NULL)
        dict = doc->dict;

    while (1) {
        xmlElementContentPtr parent;

        while ((cur->c1 != NULL) || (cur->c2 != NULL)) {
            cur = (cur->c1 != NULL) ? cur->c1 : cur->c2;
            depth += 1;
        }

	switch (cur->type) {
	    case XML_ELEMENT_CONTENT_PCDATA:
	    case XML_ELEMENT_CONTENT_ELEMENT:
	    case XML_ELEMENT_CONTENT_SEQ:
	    case XML_ELEMENT_CONTENT_OR:
		break;
	    default:
		xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"Internal: ELEMENT content corrupted invalid type\n",
			NULL);
		return;
	}
	if (dict) {
	    if ((cur->name != NULL) && (!xmlDictOwns(dict, cur->name)))
	        xmlFree((xmlChar *) cur->name);
	    if ((cur->prefix != NULL) && (!xmlDictOwns(dict, cur->prefix)))
	        xmlFree((xmlChar *) cur->prefix);
	} else {
	    if (cur->name != NULL) xmlFree((xmlChar *) cur->name);
	    if (cur->prefix != NULL) xmlFree((xmlChar *) cur->prefix);
	}
        parent = cur->parent;
        if ((depth == 0) || (parent == NULL)) {
            xmlFree(cur);
            break;
        }
        if (cur == parent->c1)
            parent->c1 = NULL;
        else
            parent->c2 = NULL;
	xmlFree(cur);

        if (parent->c2 != NULL) {
	    cur = parent->c2;
        } else {
            depth -= 1;
            cur = parent;
        }
    }
}